

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

any * __thiscall linb::any::operator=(any *this,shared_ptr<Var> *value)

{
  any local_30;
  shared_ptr<Var> *local_18;
  shared_ptr<Var> *value_local;
  any *this_local;
  
  local_18 = value;
  value_local = (shared_ptr<Var> *)this;
  any<std::shared_ptr<Var>,void>(&local_30,value);
  swap(&local_30,this);
  ~any(&local_30);
  return this;
}

Assistant:

any& operator=(ValueType&& value)
    {
        static_assert(std::is_copy_constructible<typename std::decay<ValueType>::type>::value,
            "T shall satisfy the CopyConstructible requirements.");
        any(std::forward<ValueType>(value)).swap(*this);
        return *this;
    }